

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O0

void __thiscall
Memory::HeapBlockList::
ForEachEditing<Memory::LargeHeapBlock,Memory::LargeHeapBucket::FinishPartialCollect(Memory::RecyclerSweep*)::__0>
          (HeapBlockList *this,LargeHeapBlock *list,LargeHeapBlock *tail,anon_class_16_2_03c8067a fn
          )

{
  LargeHeapBlock *pLVar1;
  LargeHeapBlock *nextBlock;
  LargeHeapBlock *heapBlock;
  LargeHeapBlock *tail_local;
  LargeHeapBlock *list_local;
  anon_class_16_2_03c8067a fn_local;
  
  fn_local.this = fn.this;
  nextBlock = (LargeHeapBlock *)this;
  list_local = tail;
  while (nextBlock != list) {
    pLVar1 = LargeHeapBlock::GetNextBlock(nextBlock);
    LargeHeapBucket::FinishPartialCollect::anon_class_16_2_03c8067a::operator()
              ((anon_class_16_2_03c8067a *)&list_local,nextBlock);
    nextBlock = pLVar1;
  }
  return;
}

Assistant:

static void ForEachEditing(TBlockType * list, TBlockType * tail,  Fn fn)
    {
        TBlockType * heapBlock = list;
        while (heapBlock != tail)
        {
            TBlockType * nextBlock = heapBlock->GetNextBlock();
            fn(heapBlock);
            heapBlock = nextBlock;
        }
    }